

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O2

ParserResult * __thiscall
Catch::Clara::Detail::
BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.cpp:2909:44)>
::setValue(ParserResult *__return_storage_ptr__,
          BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_quickfix[P]quickfix_src_C___test_catch_amalgamated_cpp:2909:44)>
          *this,string *arg)

{
  ConfigData *pCVar1;
  pointer pbVar2;
  char cVar3;
  bool bVar4;
  istream *piVar5;
  long lVar6;
  string *this_00;
  StringRef s;
  StringRef s_00;
  string line;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> temp;
  string local_2a8;
  BasicResult<Catch::Clara::ParseResultType> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  ifstream f;
  
  temp._M_dataplus._M_p = (pointer)&temp.field_2;
  temp._M_string_length = 0;
  temp.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&temp);
  local_288.m_errorMessage._M_dataplus._M_p = (pointer)&local_288.m_errorMessage.field_2;
  local_288.super_ResultValueBase<Catch::Clara::ParseResultType>.super_ResultBase.m_type = Ok;
  local_288.super_ResultValueBase<Catch::Clara::ParseResultType>.super_ResultBase._12_4_ = 0;
  local_288.super_ResultValueBase<Catch::Clara::ParseResultType>.super_ResultBase._vptr_ResultBase =
       (_func_int **)&PTR__BasicResult_002f3d40;
  local_288.m_errorMessage._M_string_length = 0;
  local_288.m_errorMessage.field_2._M_local_buf[0] = '\0';
  std::ifstream::ifstream(&f,temp._M_dataplus._M_p,_S_in);
  cVar3 = std::__basic_file<char>::is_open();
  if (cVar3 == '\0') {
    std::operator+(&local_2a8,"Unable to load input file: \'",&temp);
    std::operator+(&line,&local_2a8,'\'');
    BasicResult<Catch::Clara::ParseResultType>::runtimeError(__return_storage_ptr__,&line);
    std::__cxx11::string::~string((string *)&line);
    this_00 = &local_2a8;
  }
  else {
    line._M_dataplus._M_p = (pointer)&line.field_2;
    line._M_string_length = 0;
    line.field_2._M_local_buf[0] = '\0';
    while( true ) {
      piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&f,(string *)&line);
      lVar6 = *(long *)(*(long *)piVar5 + -0x18);
      if (((byte)piVar5[lVar6 + 0x20] & 5) != 0) break;
      trim(&local_2a8,&line);
      cVar3 = (char)lVar6;
      std::__cxx11::string::operator=((string *)&line,(string *)&local_2a8);
      std::__cxx11::string::~string((string *)&local_2a8);
      if (line._M_string_length != 0) {
        s.m_size = 0x23;
        s.m_start = (char *)line._M_string_length;
        bVar4 = startsWith((Catch *)line._M_dataplus._M_p,s,cVar3);
        if (!bVar4) {
          s_00.m_size = 0x22;
          s_00.m_start = (char *)line._M_string_length;
          bVar4 = startsWith((Catch *)line._M_dataplus._M_p,s_00,cVar3);
          if (!bVar4) {
            std::operator+(&local_258,'\"',&line);
            std::operator+(&local_2a8,&local_258,'\"');
            std::__cxx11::string::operator=((string *)&line,(string *)&local_2a8);
            std::__cxx11::string::~string((string *)&local_2a8);
            std::__cxx11::string::~string((string *)&local_258);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&((this->m_lambda).config)->testsOrTags,&line);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[2]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &((this->m_lambda).config)->testsOrTags,(char (*) [2])0x27c41d);
        }
      }
    }
    pCVar1 = (this->m_lambda).config;
    pbVar2 = (pCVar1->testsOrTags).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((pCVar1->testsOrTags).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != pbVar2) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::erase(&pCVar1->testsOrTags,pbVar2 + -1);
    }
    *(undefined8 *)
     &(__return_storage_ptr__->super_ResultValueBase<Catch::Clara::ParseResultType>).
      super_ResultBase.m_type = 0;
    (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::ParseResultType>).super_ResultBase.
    _vptr_ResultBase = (_func_int **)&PTR__BasicResult_002f3d40;
    (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_errorMessage).field_2;
    (__return_storage_ptr__->m_errorMessage)._M_string_length = 0;
    (__return_storage_ptr__->m_errorMessage).field_2._M_local_buf[0] = '\0';
    this_00 = &line;
  }
  std::__cxx11::string::~string((string *)this_00);
  std::ifstream::~ifstream(&f);
  BasicResult<Catch::Clara::ParseResultType>::~BasicResult(&local_288);
  std::__cxx11::string::~string((string *)&temp);
  return __return_storage_ptr__;
}

Assistant:

auto setValue( std::string const& arg )
                    -> ParserResult override {
                    return invokeLambda<typename UnaryLambdaTraits<L>::ArgType>(
                        m_lambda, arg );
                }